

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O2

void __thiscall lsim::ModelWire::add_segments(ModelWire *this,Point *anchors,size_t num_anchors)

{
  Point *p2;
  bool bVar1;
  size_t a;
  ulong uVar2;
  
  for (uVar2 = 1; uVar2 < num_anchors; uVar2 = uVar2 + 1) {
    p2 = anchors + 1;
    bVar1 = operator!=(anchors,p2);
    if (bVar1) {
      add_segment(this,anchors,p2);
    }
    anchors = p2;
  }
  return;
}

Assistant:

void ModelWire::add_segments(Point *anchors, size_t num_anchors) {
    for(size_t a = 1;a < num_anchors; ++a) {
        if (anchors[a - 1] != anchors[a]) {
            add_segment(anchors[a - 1], anchors[a]);
        }
    }
}